

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_voxels.cpp
# Opt level: O0

void __thiscall
FVoxelModel::RenderFrame
          (FVoxelModel *this,FTexture *skin,int frame,int frame2,double inter,int translation)

{
  FMaterial *mat;
  FMaterial *tex;
  int translation_local;
  double inter_local;
  int frame2_local;
  int frame_local;
  FTexture *skin_local;
  FVoxelModel *this_local;
  
  mat = FMaterial::ValidateTexture(skin,false);
  FRenderState::SetMaterial(&gl_RenderState,mat,5,translation,-1,false);
  FRenderState::Apply(&gl_RenderState);
  FModelVertexBuffer::SetupFrame((this->super_FModel).mVBuf,0,0,0);
  (*_ptrc_glDrawElements)(4,this->mNumIndices,0x1405,(void *)0x0);
  return;
}

Assistant:

void FVoxelModel::RenderFrame(FTexture * skin, int frame, int frame2, double inter, int translation)
{
	FMaterial * tex = FMaterial::ValidateTexture(skin, false);
	gl_RenderState.SetMaterial(tex, CLAMP_NOFILTER, translation, -1, false);

	gl_RenderState.Apply();
	mVBuf->SetupFrame(0, 0, 0);
	glDrawElements(GL_TRIANGLES, mNumIndices, GL_UNSIGNED_INT, (void*)(intptr_t)0);
}